

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

void __thiscall
OpenMD::Thermo::getInertiaTensor(Thermo *this,Mat3x3d *inertiaTensor,Vector3d *angularMomentum)

{
  bool bVar1;
  SnapshotManager *this_00;
  double *pdVar2;
  RectMatrix<double,_3U,_3U> *in_RSI;
  undefined8 *in_RDI;
  double dVar3;
  RotMat3x3d A;
  RealType m;
  Mat3x3d Itmp;
  Vector3d v;
  Vector3d r;
  Molecule *mol;
  MoleculeIterator i;
  Vector3d comVel;
  Vector3d com;
  RealType yz;
  RealType xz;
  RealType xy;
  RealType zz;
  RealType yy;
  RealType xx;
  StuntDouble *sd;
  IntegrableObjectIterator j;
  Snapshot *snap;
  Snapshot *in_stack_fffffffffffffa38;
  Snapshot *in_stack_fffffffffffffa40;
  SquareMatrix3<double> *this_01;
  StuntDouble *in_stack_fffffffffffffa48;
  iterator *in_stack_fffffffffffffa58;
  SimInfo *in_stack_fffffffffffffa60;
  SquareMatrix3<double> *in_stack_fffffffffffffa70;
  SquareMatrix3<double> *in_stack_fffffffffffffa78;
  Vector3<double> *in_stack_fffffffffffffaa0;
  Vector3<double> *in_stack_fffffffffffffaa8;
  Vector3d *in_stack_fffffffffffffb40;
  Vector3d *in_stack_fffffffffffffb48;
  Thermo *in_stack_fffffffffffffb50;
  SquareMatrix3<double> local_3d8 [7];
  double local_1a0;
  double local_150;
  Vector<double,_3U> local_148 [2];
  double local_118;
  Vector<double,_3U> local_110;
  Vector<double,_3U> local_f8;
  Molecule *local_e0;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_d8;
  double local_d0;
  Vector<double,_3U> local_c8 [2];
  double local_98;
  Vector<double,_3U> local_90 [2];
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  StuntDouble *local_30;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_28;
  Snapshot *local_20;
  RectMatrix<double,_3U,_3U> *local_10;
  
  local_10 = in_RSI;
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  local_20 = SnapshotManager::getCurrentSnapshot(this_00);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_28);
  if (((local_20->hasInertiaTensor & 1U) == 0) || ((local_20->hasCOMw & 1U) == 0)) {
    local_38 = 0.0;
    local_40 = 0.0;
    local_48 = 0.0;
    local_50 = 0.0;
    local_58 = 0.0;
    local_60 = 0.0;
    local_98 = 0.0;
    Vector<double,_3U>::Vector(local_90,&local_98);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffa40,
               (Vector<double,_3U> *)in_stack_fffffffffffffa38);
    local_d0 = 0.0;
    Vector<double,_3U>::Vector(local_c8,&local_d0);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffa40,
               (Vector<double,_3U> *)in_stack_fffffffffffffa38);
    getComAll(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_d8);
    local_118 = 0.0;
    Vector<double,_3U>::Vector(&local_110,&local_118);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffa40,
               (Vector<double,_3U> *)in_stack_fffffffffffffa38);
    local_150 = 0.0;
    Vector<double,_3U>::Vector(local_148,&local_150);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffa40,
               (Vector<double,_3U> *)in_stack_fffffffffffffa38);
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1d8f19);
    local_1a0 = 0.0;
    local_e0 = SimInfo::beginMolecule
                         (in_stack_fffffffffffffa60,(MoleculeIterator *)in_stack_fffffffffffffa58);
    while (local_e0 != (Molecule *)0x0) {
      local_30 = Molecule::beginIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      while (local_30 != (StuntDouble *)0x0) {
        StuntDouble::getPos(in_stack_fffffffffffffa48);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffa48,
                          (Vector<double,_3U> *)in_stack_fffffffffffffa40);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffa48,
                   (Vector<double,_3U> *)in_stack_fffffffffffffa40);
        StuntDouble::getVel(in_stack_fffffffffffffa48);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffa48,
                          (Vector<double,_3U> *)in_stack_fffffffffffffa40);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffa48,
                   (Vector<double,_3U> *)in_stack_fffffffffffffa40);
        local_1a0 = StuntDouble::getMass(local_30);
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,0);
        dVar3 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,0);
        local_38 = dVar3 * *pdVar2 * local_1a0 + local_38;
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,1);
        dVar3 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,1);
        local_40 = dVar3 * *pdVar2 * local_1a0 + local_40;
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,2);
        dVar3 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,2);
        local_48 = dVar3 * *pdVar2 * local_1a0 + local_48;
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,0);
        dVar3 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,1);
        local_50 = dVar3 * *pdVar2 * local_1a0 + local_50;
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,0);
        dVar3 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,2);
        local_58 = dVar3 * *pdVar2 * local_1a0 + local_58;
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,1);
        dVar3 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator[](&local_f8,2);
        local_60 = dVar3 * *pdVar2 * local_1a0 + local_60;
        cross<double>(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
        OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffa48,
                          (double)in_stack_fffffffffffffa40);
        Vector<double,_3U>::operator+=
                  ((Vector<double,_3U> *)in_stack_fffffffffffffa40,
                   (Vector<double,_3U> *)in_stack_fffffffffffffa38);
        bVar1 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffa40);
        if (bVar1) {
          StuntDouble::getA(in_stack_fffffffffffffa48);
          SquareMatrix3<double>::transpose(in_stack_fffffffffffffa78);
          (*local_30->_vptr_StuntDouble[5])
                    (local_3d8[0].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_ + 2);
          OpenMD::operator*(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
          OpenMD::operator*(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
          RectMatrix<double,_3U,_3U>::operator+=
                    ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffa40,
                     (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffa38);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1d94b9);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1d94c6);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1d94d3);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1d94e0);
          StuntDouble::getJ(in_stack_fffffffffffffa48);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffa40,
                     (Vector<double,_3U> *)in_stack_fffffffffffffa38);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1d951b);
        }
        local_30 = Molecule::nextIntegrableObject
                             ((Molecule *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      }
      local_e0 = SimInfo::nextMolecule
                           (in_stack_fffffffffffffa60,(MoleculeIterator *)in_stack_fffffffffffffa58)
      ;
    }
    dVar3 = local_40 + local_48;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,0,0);
    *pdVar2 = dVar3;
    dVar3 = -local_50;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,0,1);
    *pdVar2 = dVar3;
    dVar3 = -local_58;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,0,2);
    *pdVar2 = dVar3;
    dVar3 = -local_50;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,1,0);
    *pdVar2 = dVar3;
    dVar3 = local_38 + local_48;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,1,1);
    *pdVar2 = dVar3;
    dVar3 = -local_60;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,1,2);
    *pdVar2 = dVar3;
    dVar3 = -local_58;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,2,0);
    *pdVar2 = dVar3;
    dVar3 = -local_60;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,2,1);
    *pdVar2 = dVar3;
    dVar3 = local_38 + local_40;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,2,2);
    *pdVar2 = dVar3;
    RectMatrix<double,_3U,_3U>::operator+=
              ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffa40,
               (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffa38);
    Snapshot::setCOMw(in_stack_fffffffffffffa40,(Vector3d *)in_stack_fffffffffffffa38);
    Snapshot::setInertiaTensor(in_stack_fffffffffffffa40,(Mat3x3d *)in_stack_fffffffffffffa38);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1d993a);
  }
  this_01 = local_3d8;
  Snapshot::getCOMw(in_stack_fffffffffffffa38);
  Vector3<double>::operator=
            ((Vector3<double> *)this_01,(Vector3<double> *)in_stack_fffffffffffffa38);
  Snapshot::getInertiaTensor(in_stack_fffffffffffffa38);
  SquareMatrix3<double>::operator=(this_01,(SquareMatrix3<double> *)in_stack_fffffffffffffa38);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1d99b5);
  return;
}

Assistant:

void Thermo::getInertiaTensor(Mat3x3d& inertiaTensor,
                                Vector3d& angularMomentum) {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();
    Molecule::IntegrableObjectIterator j;
    StuntDouble* sd;

    if (!(snap->hasInertiaTensor && snap->hasCOMw)) {
      RealType xx = 0.0;
      RealType yy = 0.0;
      RealType zz = 0.0;
      RealType xy = 0.0;
      RealType xz = 0.0;
      RealType yz = 0.0;
      Vector3d com(0.0);
      Vector3d comVel(0.0);

      getComAll(com, comVel);

      SimInfo::MoleculeIterator i;
      Molecule* mol;

      Vector3d r(0.0);
      Vector3d v(0.0);
      Mat3x3d Itmp {};

      RealType m = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          r = sd->getPos() - com;
          v = sd->getVel() - comVel;

          m = sd->getMass();

          // Compute moment of intertia coefficients.
          xx += r[0] * r[0] * m;
          yy += r[1] * r[1] * m;
          zz += r[2] * r[2] * m;

          // compute products of intertia
          xy += r[0] * r[1] * m;
          xz += r[0] * r[2] * m;
          yz += r[1] * r[2] * m;

          angularMomentum += cross(r, v) * m;

          if (sd->isDirectional()) {
            RotMat3x3d A = sd->getA();
            Itmp += A.transpose() * sd->getI() * A;
            angularMomentum += sd->getJ();
          }
        }
      }

      inertiaTensor(0, 0) = yy + zz;
      inertiaTensor(0, 1) = -xy;
      inertiaTensor(0, 2) = -xz;
      inertiaTensor(1, 0) = -xy;
      inertiaTensor(1, 1) = xx + zz;
      inertiaTensor(1, 2) = -yz;
      inertiaTensor(2, 0) = -xz;
      inertiaTensor(2, 1) = -yz;
      inertiaTensor(2, 2) = xx + yy;

      inertiaTensor += Itmp;

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, inertiaTensor.getArrayPointer(), 9,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, angularMomentum.getArrayPointer(), 3,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

      snap->setCOMw(angularMomentum);
      snap->setInertiaTensor(inertiaTensor);
    }

    angularMomentum = snap->getCOMw();
    inertiaTensor   = snap->getInertiaTensor();

    return;
  }